

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

String * __thiscall
kj::_::anon_unknown_2::makeDescriptionImpl
          (String *__return_storage_ptr__,anon_unknown_2 *this,DescriptionStyle style,char *code,
          int errorNumber,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  char *pcVar1;
  int iVar2;
  ArrayPtr<const_char> *first;
  ExceptionCallback *pEVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  size_t *psVar7;
  bool bVar8;
  undefined4 in_register_00000014;
  String *pSVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  undefined4 in_register_00000084;
  size_t i;
  char *__s;
  String *pSVar14;
  char cVar15;
  size_t sVar16;
  long lVar17;
  StringPtr local_238;
  StringPtr local_228;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  StringPtr expected;
  char *macroArgs_local;
  StringPtr colon;
  StringPtr delim;
  StringPtr sep;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  
  pcVar4 = (char *)CONCAT44(in_register_00000084,errorNumber);
  __s = (char *)CONCAT44(in_register_00000014,style);
  iVar10 = (int)this;
  argNames_stack[7].ptr = (char *)0x0;
  argNames_stack[7].size_ = 0;
  argNames_stack[6].ptr = (char *)0x0;
  argNames_stack[6].size_ = 0;
  argNames_stack[5].ptr = (char *)0x0;
  argNames_stack[5].size_ = 0;
  argNames_stack[4].ptr = (char *)0x0;
  argNames_stack[4].size_ = 0;
  argNames_stack[3].ptr = (char *)0x0;
  argNames_stack[3].size_ = 0;
  argNames_stack[2].ptr = (char *)0x0;
  argNames_stack[2].size_ = 0;
  argNames_stack[1].ptr = (char *)0x0;
  argNames_stack[1].size_ = 0;
  argNames_stack[0].ptr = (char *)0x0;
  argNames_stack[0].size_ = 0;
  macroArgs_local = pcVar4;
  if (argValues.ptr < (String *)0x9) {
    argNames_heap.disposer = (ArrayDisposer *)0x0;
    argNames_heap.ptr = (ArrayPtr<const_char> *)0x0;
    argNames_heap.size_ = 0;
    first = argNames_stack;
    if (argValues.ptr == (String *)0x0) goto LAB_00175ccf;
  }
  else {
    first = HeapArrayDisposer::allocate<kj::ArrayPtr<char_const>>((size_t)argValues.ptr);
    argNames_heap.size_ = (size_t)argValues.ptr;
    argNames_heap.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
    argNames_heap.ptr = first;
  }
  pcVar4 = pcVar4 + -1;
  do {
    cVar15 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    iVar2 = isspace((int)cVar15);
  } while (iVar2 != 0);
  iVar2 = 0;
  bVar8 = false;
  pSVar9 = (String *)0x0;
  pcVar11 = pcVar4;
  while (cVar15 != '\0') {
    pcVar1 = pcVar11 + 1;
    pcVar12 = pcVar1;
    if (bVar8) {
      if (cVar15 == '\"') {
LAB_00175c2d:
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if ((cVar15 == '\\') && (pcVar12 = pcVar11 + 2, pcVar11[1] == '\0')) {
          pcVar12 = pcVar1;
        }
      }
    }
    else {
      if (cVar15 != '\"') {
        if (cVar15 == ')') {
          iVar2 = iVar2 + -1;
        }
        else if (cVar15 == '(') {
          iVar2 = iVar2 + 1;
        }
        else if (iVar2 == 0 && cVar15 == ',') {
          if (pSVar9 < argValues.ptr) {
            first[(long)pSVar9].ptr = pcVar4;
            first[(long)pSVar9].size_ = (long)pcVar11 - (long)pcVar4;
          }
          do {
            pcVar4 = pcVar11 + 1;
            iVar2 = isspace((int)pcVar11[1]);
            pcVar11 = pcVar4;
          } while (iVar2 != 0);
          pSVar9 = (String *)((long)&(pSVar9->content).ptr + 1);
          iVar2 = 0;
          bVar8 = false;
          pcVar12 = pcVar4;
          goto LAB_00175c32;
        }
        goto LAB_00175c2d;
      }
      bVar8 = true;
    }
LAB_00175c32:
    pcVar11 = pcVar12;
    cVar15 = *pcVar12;
  }
  if (pSVar9 < argValues.ptr) {
    first[(long)pSVar9].ptr = pcVar4;
    first[(long)pSVar9].size_ = (long)pcVar11 - (long)pcVar4;
  }
  if ((String *)((long)&(pSVar9->content).ptr + 1) != argValues.ptr) {
    pEVar3 = getExceptionCallback();
    expected.content.ptr = (char *)argValues.ptr;
    local_228.content.ptr = (char *)CONCAT71(local_228.content.ptr._1_7_,10);
    str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
              ((String *)buffer,(kj *)"Failed to parse logging macro args into ",
               (char (*) [41])&expected,(unsigned_long *)" names: ",(char (*) [9])&macroArgs_local,
               (char **)&local_228,(char *)__return_storage_ptr__);
    (*pEVar3->_vptr_ExceptionCallback[4])
              (pEVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug.c++"
               ,0xd9,0,buffer);
    Array<char>::~Array((Array<char> *)buffer);
  }
LAB_00175ccf:
  if (((iVar10 == 2) && (pcVar4 = strchr(__s,0x3d), pcVar4 != (char *)0x0)) && (pcVar4[1] != '=')) {
    do {
      __s = pcVar4 + 1;
      iVar2 = isspace((int)pcVar4[1]);
      pcVar4 = __s;
    } while (iVar2 != 0);
  }
  iVar2 = 0;
  if (__s != (char *)0x0) {
    iVar2 = iVar10;
  }
  if (iVar10 != 1) {
    iVar2 = iVar10;
  }
  expected.content.ptr = "expected ";
  expected.content.size_ = 10;
  if (iVar2 == 0) {
    sVar16 = 1;
    __s = "";
  }
  else {
    sVar5 = strlen(__s);
    sVar16 = sVar5 + 1;
  }
  sep.content.ptr = " = ";
  sep.content.size_ = 4;
  delim.content.ptr = "; ";
  delim.content.size_ = 3;
  colon.content.ptr = ": ";
  colon.content.size_ = 3;
  local_238.content.ptr = "";
  local_238.content.size_ = 1;
  local_228.content.ptr = __s;
  local_228.content.size_ = sVar16;
  if (iVar2 == 2) {
    pcVar4 = strerror_r((int)code,buffer,0x100);
    sVar5 = strlen(pcVar4);
    local_238.content.size_ = sVar5 + 1;
    sVar16 = sVar16 + sVar5 + 1;
    local_238.content.ptr = pcVar4;
  }
  else if (iVar2 == 1) {
    sVar16 = sVar16 + 8;
  }
  else {
    sVar16 = 0;
  }
  plVar6 = (long *)(macroArgs + 8);
  psVar7 = &first->size_;
  for (pSVar9 = (String *)0x0; argValues.ptr != pSVar9;
      pSVar9 = (String *)((long)&(pSVar9->content).ptr + 1)) {
    lVar13 = (ulong)(pSVar9 != (String *)0x0 || iVar2 != 0) * 2 + sVar16;
    if ((*psVar7 != 0) && (*((ArrayPtr<const_char> *)(psVar7 + -1))->ptr != '\"')) {
      lVar13 = lVar13 + *psVar7 + 3;
    }
    lVar17 = 0;
    if (*plVar6 != 0) {
      lVar17 = *plVar6 + -1;
    }
    sVar16 = lVar17 + lVar13;
    plVar6 = plVar6 + 3;
    psVar7 = psVar7 + 2;
  }
  pSVar9 = __return_storage_ptr__;
  heapString(__return_storage_ptr__,sVar16);
  pcVar4 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->content).ptr;
  }
  if (iVar2 == 1) {
    pcVar4 = fill<kj::StringPtr,kj::StringPtr&>(pcVar4,&expected,&local_228);
  }
  else if (iVar2 == 2) {
    pcVar4 = fill<kj::StringPtr,kj::StringPtr&,kj::StringPtr&>(pcVar4,&local_228,&colon,&local_238);
  }
  lVar13 = 0;
  for (pSVar14 = (String *)0x0; pSVar14 < argValues.ptr;
      pSVar14 = (String *)((long)&(pSVar14->content).ptr + 1)) {
    if (iVar2 != 0 || pSVar14 != (String *)0x0) {
      pcVar4 = fill<kj::StringPtr>(pcVar4,&delim);
    }
    if ((first->size_ != 0) && (*first->ptr != '\"')) {
      pcVar4 = fill<kj::ArrayPtr<char_const>,kj::StringPtr&>(pcVar4,first,&sep);
    }
    pcVar4 = fill<kj::String>(pcVar4,(String *)(macroArgs + lVar13));
    lVar13 = lVar13 + 0x18;
    first = first + 1;
  }
  Array<kj::ArrayPtr<const_char>_>::~Array(&argNames_heap);
  return pSVar9;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index] = arrayPtr(start, pos - 1);
          }
          ++index;
          while (isspace(*pos)) ++pos;
          start = pos;
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index] = arrayPtr(start, pos - 1);
    }
    ++index;

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (argNames[i].size() > 0 && argNames[i][0] != '\"') {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}